

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyMarkBigBlockList(Recycler *this,BigBlock *memoryBlocks)

{
  ulong uVar1;
  BigBlock *blockp;
  ulong uVar2;
  
  if (memoryBlocks != (BigBlock *)0x0) {
    do {
      uVar1 = memoryBlocks->currentByte;
      if (7 < uVar1) {
        uVar2 = 0;
        do {
          VerifyMark(this,(void *)0x0,(&memoryBlocks[1].super_ArenaMemoryBlock.field_0)[uVar2].next)
          ;
          uVar2 = uVar2 + 1;
        } while (uVar1 >> 3 != uVar2);
      }
      memoryBlocks = (memoryBlocks->super_ArenaMemoryBlock).field_0.nextBigBlock;
    } while (memoryBlocks != (BigBlock *)0x0);
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkBigBlockList(BigBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    BigBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->currentByte / sizeof(void*);
        scanRootBytes +=  blockp->currentByte;
        for (size_t i=0; i < slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->nextBigBlock;
    }
}